

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O3

int alsa_stop_voice(ALLEGRO_VOICE *voice)

{
  void *pvVar1;
  
  pvVar1 = voice->extra;
  *(undefined1 *)((long)pvVar1 + 0x11) = 1;
  al_signal_cond(voice->cond);
  if (voice->is_streaming == false) {
    voice->attached_stream->pos = 0;
  }
  if (*(char *)((long)pvVar1 + 0x12) == '\0') {
    do {
      al_wait_cond(voice->cond,voice->mutex);
    } while (*(char *)((long)pvVar1 + 0x12) != '\x01');
  }
  return 0;
}

Assistant:

static int alsa_stop_voice(ALLEGRO_VOICE *voice)
{
   ALSA_VOICE *ex_data = voice->extra;

   /* We already hold voice->mutex. */
   ex_data->stop = true;
   al_signal_cond(voice->cond);

   if (!voice->is_streaming) {
      voice->attached_stream->pos = 0;
   }

   while (!ex_data->stopped) {
      al_wait_cond(voice->cond, voice->mutex);
   }

   return 0;
}